

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDIOAnalyzerResults.cpp
# Opt level: O0

void __thiscall
MDIOAnalyzerResults::GenC45DevTypeString
          (MDIOAnalyzerResults *this,Frame *frame,DisplayBase display_base,char *devtype,
          bool tabular)

{
  char local_b8 [8];
  char number_str [128];
  bool tabular_local;
  char *devtype_local;
  DisplayBase display_base_local;
  Frame *frame_local;
  MDIOAnalyzerResults *this_local;
  
  AnalyzerHelpers::GetNumberString(*(ulonglong *)(frame + 0x10),display_base,5,local_b8,0x80);
  if (!tabular) {
    AnalyzerResults::AddResultString
              ((char *)this,"DEV",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString((char *)this,"DEVTYPE[",devtype,"]",(char *)0x0,(char *)0x0);
  }
  AnalyzerResults::AddResultString((char *)this,"DEVTYPE [",devtype,"] - ",local_b8,(char *)0x0);
  return;
}

Assistant:

void MDIOAnalyzerResults::GenC45DevTypeString( const Frame& frame, DisplayBase display_base, const char* devtype, bool tabular )
{
    char number_str[ 128 ];
    AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 5, number_str, 128 );

    if( !tabular )
    {
        AddResultString( "DEV" );
        AddResultString( "DEVTYPE[", devtype, "]" );
    }
    AddResultString( "DEVTYPE [", devtype, "] - ", number_str );
}